

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlregexp.c
# Opt level: O3

xmlAutomataStatePtr
xmlAutomataNewCounterTrans
          (xmlAutomataPtr am,xmlAutomataStatePtr from,xmlAutomataStatePtr to,int counter)

{
  xmlRegStatePtr target;
  
  if (counter < 0 || (from == (xmlAutomataStatePtr)0x0 || am == (xmlAutomataPtr)0x0)) {
    to = (xmlAutomataStatePtr)0x0;
  }
  else if (to == (xmlAutomataStatePtr)0x0) {
    target = xmlRegStatePush(am);
    if (target != (xmlRegStatePtr)0x0) {
      am->state = target;
      xmlRegStateAddTrans(am,from,(xmlRegAtomPtr)0x0,target,-1,counter);
    }
    to = am->state;
  }
  else {
    xmlRegStateAddTrans(am,from,(xmlRegAtomPtr)0x0,to,-1,counter);
  }
  return to;
}

Assistant:

xmlAutomataStatePtr
xmlAutomataNewCounterTrans(xmlAutomataPtr am, xmlAutomataStatePtr from,
		xmlAutomataStatePtr to, int counter) {
    if ((am == NULL) || (from == NULL) || (counter < 0))
	return(NULL);
    xmlFAGenerateCountedTransition(am, from, to, counter);
    if (to == NULL)
	return(am->state);
    return(to);
}